

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O2

void __thiscall tli_window_manager::Text::Text(Text *this,Text *other)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  (this->super_Observer)._vptr_Observer = (_func_int **)&PTR___cxa_pure_virtual_00109da0;
  Box::Box(&this->super_Box);
  (this->super_Observer)._vptr_Observer = (_func_int **)&PTR_set_position_00109ca8;
  (this->super_Box)._vptr_Box = (_func_int **)&PTR_layout_00109ce8;
  std::__cxx11::string::string((string *)&this->buffer_,(string *)&other->buffer_);
  iVar1 = other->frame_height_;
  iVar2 = other->cursor_position_;
  iVar3 = other->index_;
  this->frame_width_ = other->frame_width_;
  this->frame_height_ = iVar1;
  this->cursor_position_ = iVar2;
  this->index_ = iVar3;
  return;
}

Assistant:

Text::Text(const Text &other) : frame_width_{other.frame_width_}, frame_height_{other.frame_height_},
                                cursor_position_{other.cursor_position_}, index_{other.index_},
                                buffer_{other.buffer_} {}